

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int cbb_add_u(CBB *cbb,uint64_t v,size_t len_len)

{
  int iVar1;
  uint8_t *local_38;
  size_t i;
  uint8_t *buf;
  size_t len_len_local;
  uint64_t v_local;
  CBB *cbb_local;
  
  buf = (uint8_t *)len_len;
  len_len_local = v;
  v_local = (uint64_t)cbb;
  iVar1 = CBB_add_space(cbb,(uint8_t **)&i,len_len);
  local_38 = buf;
  if (iVar1 == 0) {
    cbb_local._4_4_ = 0;
  }
  else {
    while (local_38 = local_38 + -1, local_38 < buf) {
      local_38[i] = (uint8_t)len_len_local;
      len_len_local = len_len_local >> 8;
    }
    if (len_len_local == 0) {
      cbb_local._4_4_ = 1;
    }
    else {
      cbb_on_error((CBB *)v_local);
      cbb_local._4_4_ = 0;
    }
  }
  return cbb_local._4_4_;
}

Assistant:

static int cbb_add_u(CBB *cbb, uint64_t v, size_t len_len) {
  uint8_t *buf;
  if (!CBB_add_space(cbb, &buf, len_len)) {
    return 0;
  }

  for (size_t i = len_len - 1; i < len_len; i--) {
    buf[i] = v;
    v >>= 8;
  }

  // |v| must fit in |len_len| bytes.
  if (v != 0) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}